

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

Size __thiscall asl::Console::size(Console *this)

{
  int iVar1;
  ulong in_RAX;
  Size SVar2;
  WinSize win;
  ulong local_18;
  
  SVar2.w = 0;
  SVar2.h = 0;
  local_18 = in_RAX;
  iVar1 = ioctl(0,0x5413,&local_18);
  if (iVar1 == 0) {
    SVar2 = (Size)((local_18 & 0xffff) << 0x20 | local_18 >> 0x10 & 0xffff);
  }
  return SVar2;
}

Assistant:

Console::Size Console::size()
{
	struct WinSize
	{
		unsigned short ws_row;
		unsigned short ws_col;
		unsigned short ws_xpixel;
		unsigned short ws_ypixel;
	};
	WinSize win;
	
	Console::Size s = {0, 0};

	if (ioctl(0, TIOCGWINSZ, &win) == 0)
	{
		s.h = win.ws_row;
		s.w = win.ws_col;
	}
	return s;
}